

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O3

void FreeMemory(void)

{
  free(mText);
  free(mLevel);
  free(mChildCount);
  free(mPosition);
  free(mParent);
  free(mPrev);
  free(mNext);
  free(mBuf);
  return;
}

Assistant:

VOID
  FreeMemory (
  VOID
  )
  /*++

  Routine Description:

  Called when compression is completed to free memory previously allocated.

  Arguments: (VOID)

  Returns: (VOID)

  --*/
{
    free (mText);
    free (mLevel);
    free (mChildCount);
    free (mPosition);
    free (mParent);
    free (mPrev);
    free (mNext);
    free (mBuf);
}